

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

string * efsw::FileSystem::getRealPath(string *__return_storage_ptr__,string *path)

{
  size_t sVar1;
  char dir [4096];
  undefined1 *local_1048 [2];
  undefined1 local_1038 [16];
  char local_1028 [4104];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  realpath((path->_M_dataplus)._M_p,local_1028);
  local_1048[0] = local_1038;
  sVar1 = strlen(local_1028);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1048,local_1028,local_1028 + sVar1);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1048);
  if (local_1048[0] != local_1038) {
    operator_delete(local_1048[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileSystem::getRealPath( const std::string& path ) {
	std::string realPath;
#if defined( EFSW_PLATFORM_POSIX )
	char dir[PATH_MAX];
	realpath( path.c_str(), &dir[0] );
	realPath = std::string( dir );
#elif EFSW_OS == EFSW_OS_WIN
	wchar_t dir[_MAX_PATH + 1];
	GetFullPathNameW( String::fromUtf8( path ).toWideString().c_str(), _MAX_PATH, &dir[0],
					  nullptr );
	realPath = String( dir ).toUtf8();
#else
#warning FileSystem::getRealPath() not implemented on this platform.
#endif
	return realPath;
}